

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O1

void __thiscall
TEST_MockParameterTest_doubleParameterNotEqualIfOutsideTolerance_Test::testBody
          (TEST_MockParameterTest_doubleParameterNotEqualIfOutsideTolerance_Test *this)

{
  int iVar1;
  MockCheckedExpectedCall *pMVar2;
  UtestShell *test;
  MockSupport *pMVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  MockFailureReporterInstaller failureReporterInstaller;
  MockExpectedCallsListForTest expectations;
  MockUnexpectedInputParameterFailure expectedFailure;
  MockNamedValue parameter;
  MockFailureReporterInstaller local_101;
  SimpleString local_100;
  SimpleString local_f0;
  SimpleString local_e0;
  MockExpectedCallsList local_d0;
  TestFailure local_c0;
  MockNamedValue local_58;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller(&local_101);
  MockExpectedCallsList::MockExpectedCallsList(&local_d0);
  local_d0._vptr_MockExpectedCallsList = (_func_int **)&PTR__MockExpectedCallsListForTest_002aaff0;
  SimpleString::SimpleString((SimpleString *)&local_c0,"foo");
  pMVar2 = MockExpectedCallsListForTest::addFunction
                     ((MockExpectedCallsListForTest *)&local_d0,(SimpleString *)&local_c0);
  SimpleString::SimpleString((SimpleString *)&local_58,"parameter");
  (*(pMVar2->super_MockExpectedCall)._vptr_MockExpectedCall[0x11])
            (0x4059000000000000,pMVar2,&local_58);
  SimpleString::~SimpleString((SimpleString *)&local_58);
  SimpleString::~SimpleString((SimpleString *)&local_c0);
  SimpleString::SimpleString((SimpleString *)&local_c0,"parameter");
  MockNamedValue::MockNamedValue(&local_58,(SimpleString *)&local_c0);
  SimpleString::~SimpleString((SimpleString *)&local_c0);
  MockNamedValue::setValue(&local_58,106.0);
  test = mockFailureTest();
  SimpleString::SimpleString(&local_100,"foo");
  MockUnexpectedInputParameterFailure::MockUnexpectedInputParameterFailure
            ((MockUnexpectedInputParameterFailure *)&local_c0,test,&local_100,&local_58,&local_d0);
  SimpleString::~SimpleString(&local_100);
  SimpleString::SimpleString(&local_100,"");
  pMVar3 = mock(&local_100,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_e0,"foo");
  iVar1 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,&local_e0);
  SimpleString::SimpleString(&local_f0,"parameter");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x90))
            (0x4059000000000000,0x4014000000000000,(long *)CONCAT44(extraout_var,iVar1),&local_f0);
  SimpleString::~SimpleString(&local_f0);
  SimpleString::~SimpleString(&local_e0);
  SimpleString::~SimpleString(&local_100);
  SimpleString::SimpleString(&local_100,"");
  pMVar3 = mock(&local_100,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_e0,"foo");
  iVar1 = (*pMVar3->_vptr_MockSupport[6])(pMVar3,&local_e0);
  SimpleString::SimpleString(&local_f0,"parameter");
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x70))
            (0x405a800000000000,(long *)CONCAT44(extraout_var_00,iVar1),&local_f0);
  SimpleString::~SimpleString(&local_f0);
  SimpleString::~SimpleString(&local_e0);
  SimpleString::~SimpleString(&local_100);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            ((MockFailure *)&local_c0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
             ,0x13f);
  TestFailure::~TestFailure(&local_c0);
  MockNamedValue::~MockNamedValue(&local_58);
  MockExpectedCallsListForTest::~MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)&local_d0);
  MockFailureReporterInstaller::~MockFailureReporterInstaller(&local_101);
  return;
}

Assistant:

TEST(MockParameterTest, doubleParameterNotEqualIfOutsideTolerance)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foo")->withParameter("parameter", 100.0);
    MockNamedValue parameter("parameter");
    parameter.setValue(106.0);
    MockUnexpectedInputParameterFailure expectedFailure(mockFailureTest(), "foo", parameter, expectations);

    mock( ).expectOneCall("foo").withParameter("parameter", 100.0, 5.0);
    mock( ).actualCall("foo").withParameter("parameter", 106.0);

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}